

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall libcellml::Variable::VariableImpl::cleanExpiredVariables(VariableImpl *this)

{
  pointer pwVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  long lVar5;
  const_iterator __first;
  __weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  const_iterator __last;
  
  pwVar1 = (this->mEquivalentVariables).
           super__Vector_base<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->mEquivalentVariables).
       super__Vector_base<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)__last._M_current - (long)pwVar1;
  p_Var3 = &pwVar1[2].super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
  for (lVar5 = lVar4 >> 6; 0 < lVar5; lVar5 = lVar5 + -1) {
    p_Var2 = p_Var3[-2]._M_refcount._M_pi;
    if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var2->_M_use_count == 0)) {
      __first._M_current = (weak_ptr<libcellml::Variable> *)(p_Var3 + -2);
      goto LAB_0022d070;
    }
    p_Var2 = p_Var3[-1]._M_refcount._M_pi;
    if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var2->_M_use_count == 0)) {
      __first._M_current = (weak_ptr<libcellml::Variable> *)(p_Var3 + -1);
      goto LAB_0022d070;
    }
    p_Var2 = (p_Var3->_M_refcount)._M_pi;
    __first._M_current = (weak_ptr<libcellml::Variable> *)p_Var3;
    if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var2->_M_use_count == 0)) goto LAB_0022d070;
    p_Var2 = p_Var3[1]._M_refcount._M_pi;
    if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var2->_M_use_count == 0)) {
      __first._M_current = (weak_ptr<libcellml::Variable> *)(p_Var3 + 1);
      goto LAB_0022d070;
    }
    p_Var3 = p_Var3 + 4;
    lVar4 = lVar4 + -0x40;
  }
  lVar4 = lVar4 >> 4;
  p_Var6 = p_Var3 + -2;
  if (lVar4 == 1) {
LAB_0022d11a:
    p_Var2 = (p_Var6->_M_refcount)._M_pi;
    __first._M_current = (weak_ptr<libcellml::Variable> *)p_Var6;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (p_Var2->_M_use_count != 0)) {
      __first._M_current = __last._M_current;
    }
  }
  else if (lVar4 == 3) {
    p_Var2 = p_Var3[-2]._M_refcount._M_pi;
    __first._M_current = (weak_ptr<libcellml::Variable> *)p_Var6;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (p_Var2->_M_use_count != 0)) {
      p_Var6 = p_Var3 + -1;
      goto LAB_0022d0fd;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (lVar4 != 2) goto LAB_0022d0ac;
LAB_0022d0fd:
    p_Var2 = (p_Var6->_M_refcount)._M_pi;
    __first._M_current = (weak_ptr<libcellml::Variable> *)p_Var6;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (p_Var2->_M_use_count != 0)) {
      p_Var6 = p_Var6 + 1;
      goto LAB_0022d11a;
    }
  }
LAB_0022d070:
  p_Var3 = &(__first._M_current)->super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
  if (__first._M_current != __last._M_current) {
    while (p_Var6 = &(__first._M_current)->
                     super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> + 1,
          p_Var6 != &(__last._M_current)->
                     super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>) {
      p_Var2 = (&(__first._M_current)->
                 super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)[1]._M_refcount.
               _M_pi;
      __first._M_current = (weak_ptr<libcellml::Variable> *)p_Var6;
      if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (p_Var2->_M_use_count != 0)) {
        std::__weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var3,p_Var6);
        p_Var3 = p_Var3 + 1;
      }
    }
    __last._M_current =
         (this->mEquivalentVariables).
         super__Vector_base<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    __first._M_current = (weak_ptr<libcellml::Variable> *)p_Var3;
  }
LAB_0022d0ac:
  std::
  vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>::
  erase(&this->mEquivalentVariables,__first,__last);
  return;
}

Assistant:

void Variable::VariableImpl::cleanExpiredVariables()
{
    mEquivalentVariables.erase(std::remove_if(mEquivalentVariables.begin(), mEquivalentVariables.end(), [=](const VariableWeakPtr &variableWeak) -> bool { return variableWeak.expired(); }), mEquivalentVariables.end());
}